

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

char * get_line(char *buf,int len,FILE *input)

{
  bool bVar1;
  char *__s;
  size_t sVar2;
  size_t rlen;
  char *b;
  _Bool partial;
  FILE *input_local;
  int len_local;
  char *buf_local;
  
  bVar1 = false;
  while( true ) {
    while( true ) {
      __s = fgets(buf,len,(FILE *)input);
      if (__s == (char *)0x0) {
        return (char *)0x0;
      }
      sVar2 = strlen(__s);
      if ((sVar2 != 0) && (__s[sVar2 - 1] == '\n')) break;
      bVar1 = true;
    }
    if (!bVar1) break;
    bVar1 = false;
  }
  return __s;
}

Assistant:

static char *get_line(char *buf, int len, FILE *input)
{
  bool partial = FALSE;
  while(1) {
    char *b = fgets(buf, len, input);
    if(b) {
      size_t rlen = strlen(b);
      if(rlen && (b[rlen-1] == '\n')) {
        if(partial) {
          partial = FALSE;
          continue;
        }
        return b;
      }
      /* read a partial, discard the next piece that ends with newline */
      partial = TRUE;
    }
    else
      break;
  }
  return NULL;
}